

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O0

bool Am_Check_One_Object_For_Inactive(Am_Object *object,Am_Slot_Key slot_for_inactive)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_48;
  Am_Object cmd;
  undefined1 local_30 [8];
  Am_Value value;
  Am_Slot_Key slot_for_inactive_local;
  Am_Object *object_local;
  
  value.value.long_value._6_2_ = slot_for_inactive;
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(object,0x157,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if (bVar1) {
    Am_Object::Am_Object(&local_48,(Am_Value *)local_30);
    pAVar2 = Am_Object::Peek(&local_48,value.value.long_value._6_2_,0);
    Am_Value::operator=((Am_Value *)local_30,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)local_30);
    if (bVar1) {
      object_local._7_1_ = 0;
    }
    Am_Object::~Am_Object(&local_48);
    if (bVar1) goto LAB_00225b61;
  }
  object_local._7_1_ = 1;
LAB_00225b61:
  Am_Value::~Am_Value((Am_Value *)local_30);
  return (bool)(object_local._7_1_ & 1);
}

Assistant:

bool
Am_Check_One_Object_For_Inactive(Am_Object &object,
                                 Am_Slot_Key slot_for_inactive)
{
  Am_Value value;
  value = object.Peek(Am_INACTIVE_COMMANDS);
  if (value.Valid()) {
    Am_Object cmd = value;
    value = cmd.Peek(slot_for_inactive);
    if (value.Valid())
      return false;
  }
  return true; //if get here, all selected items are fine
}